

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thr_unlink.c
# Opt level: O2

void * rm_thread_forward(void *objs_ptr)

{
  int error;
  obj *poVar1;
  char *n;
  objlist *poVar2;
  long lVar3;
  
  poVar2 = (objlist *)objs_ptr;
  for (lVar3 = 8; lVar3 != 0x7d08; lVar3 = lVar3 + 0x20) {
    poVar2 = &list;
    ll_ref(&list.ll_head,(ll_elem *)((long)objs_ptr + lVar3));
  }
  error = barrier_wait((pthread_barrier_t *)poVar2);
  n = "pthread_barrier_wait";
  must_succeed(error,"pthread_barrier_wait");
  lVar3 = 0;
  poVar2 = (objlist *)objs_ptr;
  do {
    lVar3 = lVar3 + -0x20;
    if (lVar3 == -0x7d20) {
      return (void *)0x0;
    }
    poVar1 = ll_unlink_objlist(poVar2,(obj *)n);
    poVar2 = poVar2 + 1;
  } while (poVar1 != (obj *)0x0);
  unlink_fail((obj *)((long)objs_ptr + (-0x20 - lVar3)));
  return (void *)0x0;
}

Assistant:

void*
rm_thread_forward(void *objs_ptr)
{
	struct obj *objs = objs_ptr;
	int i;

	for (i = 0; i < N; i++)
		LL_REF(objlist, &list, &objs[i]);
	must_succeed(barrier_wait(&barrier), "pthread_barrier_wait");

	for (i = 0; i < N; i++) {
		if (!LL_UNLINK(objlist, &list, &objs[i]))
			unlink_fail(&objs[i]);
	}
	return NULL;
}